

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O1

void aes_sw_setkey(ssh_cipher *ciph,void *vkey)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ulong uVar12;
  size_t i_3;
  ulong uVar13;
  long lVar14;
  size_t i_1;
  size_t i;
  ulong uVar15;
  uint uVar16;
  ulong uVar18;
  int iVar19;
  ushort uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ushort uVar27;
  uint uVar28;
  ulong uVar29;
  ushort uVar30;
  uint uVar31;
  ssh_cipher *__s;
  bool bVar32;
  uint8_t inblk [16];
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  ulong local_a8;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  ssh_cipher *local_80;
  undefined8 local_78;
  ulong local_70;
  ulong local_68;
  ssh_cipher *local_60;
  undefined8 local_58;
  undefined8 local_50;
  void *local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar17;
  
  iVar19 = ciph->vt->real_keybits;
  uVar29 = (ulong)(long)iVar19 >> 5;
  *(int *)&ciph[-0xc].vt = (iVar19 >> 5) + 6;
  uVar16 = (int)uVar29 * 4 + 0x1c;
  uVar17 = (ulong)uVar16;
  __s = ciph + -0x2a;
  local_80 = ciph;
  local_48 = vkey;
  memset(__s,0,0xf0);
  local_d8 = 0;
  uStack_d0 = 0;
  local_a8 = uVar17;
  if (uVar16 != 0) {
    local_78 = 0;
    local_50 = 0;
    local_58 = 0;
    local_60 = local_80 + -0x2a;
    uVar18 = uVar29 * -2;
    local_c4 = 0;
    iVar19 = 0;
    uVar22 = 0;
    uVar16 = 0xfffffffe;
    do {
      local_84 = uVar16;
      local_70 = uVar29;
      if (uVar22 < uVar29) {
        uVar16 = *(uint *)((long)local_48 + uVar22 * 4);
        local_d8 = (ulong)uVar16;
        uVar12 = local_d8;
        local_d8._1_1_ = (byte)(uVar16 >> 8);
        local_d8._2_1_ = (byte)(uVar16 >> 0x10);
        uVar15 = (ulong)local_d8._2_1_ << 0x10 | (ulong)local_d8._1_1_ << 8 | (ulong)(uVar16 & 0xff)
        ;
        local_d8._3_1_ = (byte)(uVar16 >> 0x18);
        uVar13 = (ulong)local_d8._3_1_ << 0x18 | uVar15;
        uVar13 = ((uVar13 >> 7 ^ uVar15) & 0xaa00aa00aa00aa) * 0x81 ^ uVar13;
        uVar13 = ((uVar13 >> 0xe ^ uVar13) & 0xcccc0000cccc) * 0x4001 ^ uVar13;
        uVar15 = (ulong)((uint)uVar13 & 0xf0f0f0f0);
        uVar13 = (uVar15 << 0x1c | uVar15) ^ uVar13;
        uVar15 = uVar13 >> 8 & 0xff00ff00ff00ff;
        uVar13 = uVar15 << 8 ^ uVar13;
        local_108 = CONCAT22((short)uVar15,(short)uVar13);
        local_104 = CONCAT22((short)(uVar15 >> 0x10),(short)(uVar13 >> 0x10));
        local_100 = CONCAT22((short)(uVar15 >> 0x20),(short)(uVar13 >> 0x20));
        local_fc = CONCAT22((short)(uVar15 >> 0x30),(short)(uVar13 >> 0x30));
        local_d8 = uVar12;
      }
      else {
        lVar14 = 0;
        do {
          *(ushort *)((long)&local_108 + lVar14 * 2) =
               *(ushort *)((long)&local_60[(ulong)(local_84 >> 3) * 2].vt + lVar14 * 2) >>
               ((char)uVar22 * '\x04' - 4U & 0xc);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 8);
        local_38 = uVar22 % uVar29;
        if (local_38 == 0) {
          bVar32 = true;
          lVar14 = 0;
          do {
            uVar27 = *(ushort *)((long)&local_108 + lVar14 * 2);
            *(ushort *)((long)&local_108 + lVar14 * 2) = (uVar27 >> 1 | uVar27 * 8) & 0xf;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
        }
        else {
          bVar32 = ((uint)uVar22 & 7) == 4 && uVar29 == 8;
        }
        if (bVar32) {
          local_88 = local_104 ^ local_100;
          local_bc = (uint)(local_108._2_2_ ^ local_fc._2_2_);
          local_8c = local_fc._2_2_ ^ local_100;
          local_b0 = local_fc._2_2_ ^ local_104;
          uVar27 = local_100._2_2_ ^ (ushort)local_fc;
          uVar30 = (ushort)(local_bc ^ local_88);
          uVar25 = (uint)(local_104._2_2_ ^ uVar30);
          local_104 = local_104 ^ uVar25;
          uVar25 = uVar25 ^ local_fc;
          local_94 = local_104 ^ uVar27;
          local_dc = uVar25 ^ local_8c;
          local_90 = local_94 ^ local_dc;
          uVar21 = local_90 & local_88 ^ local_dc & local_8c;
          uVar31 = local_94 & local_b0 ^ local_dc & local_8c;
          uVar24 = uVar27 ^ local_108;
          local_b4 = local_108._2_2_ ^ uVar24;
          local_98 = local_b4 ^ local_b0;
          local_a0 = local_108;
          uVar16 = local_104 & (local_bc ^ local_88);
          local_c0 = uVar27 ^ local_dc;
          uVar26 = uVar25 ^ uVar16 ^ (local_104 ^ local_108) & local_98 ^ uVar21;
          uVar21 = local_b4 & uVar24 ^ local_c0 ^ local_c0 & local_bc ^ local_bc ^ uVar21;
          local_9c = uVar24 ^ local_fc._2_2_;
          uVar25 = (local_100 ^ uVar24) & local_108 ^ local_b0 ^ local_94 ^ uVar16 ^ uVar31;
          uVar31 = local_c0 & local_bc ^ (uint)local_fc._2_2_ ^
                   (local_dc ^ local_108) & local_9c ^ local_c0 ^ uVar31;
          uVar16 = uVar21 & uVar26;
          uVar26 = uVar26 ^ uVar25;
          uVar28 = (uVar31 ^ uVar16) & uVar26 ^ uVar25;
          uVar25 = (uVar25 ^ uVar16) & (uVar31 ^ uVar21);
          uVar23 = uVar25 ^ uVar31;
          uVar25 = (uVar25 ^ uVar16) & uVar31;
          uVar21 = uVar21 ^ uVar25;
          uVar26 = (uVar25 ^ uVar31 ^ uVar16) & uVar28 ^ uVar26;
          uVar16 = uVar21 ^ uVar23;
          local_ac = (local_104 ^ local_108) & uVar16;
          uVar31 = uVar28 ^ uVar23;
          local_c0 = local_c0 & (uVar26 ^ uVar28);
          uVar10 = (ushort)(uVar26 ^ uVar28) & (local_108._2_2_ ^ local_fc._2_2_);
          local_b8 = uVar24 & uVar26;
          local_ec = (local_dc ^ local_108) & uVar28;
          local_e4 = uVar26 ^ uVar16 ^ uVar31;
          local_dc = local_dc & uVar31;
          uVar27 = (ushort)local_90 & (ushort)local_e4;
          local_e4 = local_e4 & local_88;
          uVar11 = (ushort)(uVar26 ^ uVar16);
          local_e8 = uVar23 & (local_100 ^ uVar24) ^ uVar16 & local_98;
          uVar3 = (ushort)uVar26 & (ushort)local_b4 ^ (ushort)local_ec;
          local_ec = local_ec ^ local_108 & uVar23;
          local_e0 = local_104 & uVar21 ^ local_c0;
          uVar8 = (ushort)local_dc ^ (ushort)local_c0 ^ uVar27;
          uVar7 = uVar10 ^ (ushort)(local_108 & uVar23) ^ (ushort)local_e0;
          uVar4 = (ushort)uVar31 & (ushort)local_8c ^ (ushort)local_e4;
          uVar9 = uVar4 ^ (ushort)local_b8;
          uVar6 = (ushort)local_94 & uVar11 ^ uVar27 ^ uVar9;
          uVar9 = uVar9 ^ (ushort)(uVar16 & local_98) ^ (ushort)uVar21 & uVar30;
          uVar30 = (ushort)local_b8 ^ uVar8;
          uVar5 = (ushort)local_ac ^ uVar9;
          uVar27 = (ushort)uVar28 & (ushort)local_9c ^ uVar7 ^ uVar6;
          uVar20 = (ushort)local_e0 ^ uVar5;
          local_104 = CONCAT22(uVar5 ^ (ushort)local_ec,(ushort)local_e8 ^ uVar27);
          local_108 = CONCAT22(~(uVar6 ^ uVar10 ^ uVar3),~(uVar7 ^ uVar3 ^ uVar4));
          local_100 = CONCAT22(~(uVar11 & (ushort)local_b0 ^ (ushort)local_e4 ^ uVar30 ^ uVar27),
                               uVar20);
          local_fc = CONCAT22(uVar9 ^ uVar8,~(uVar20 ^ uVar30));
          local_68 = uVar22;
        }
        local_40 = uVar18;
        if (local_38 == 0) {
          if (9 < local_c4) {
            __assert_fail("rconpos < lenof(aes_key_setup_round_constants)",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-sw.c"
                          ,0x2b4,"void aes_sliced_key_setup(aes_sliced_key *, const void *, size_t)"
                         );
          }
          bVar2 = aes_key_setup_round_constants[local_c4];
          lVar14 = 0;
          do {
            puVar1 = (ushort *)((long)&local_108 + lVar14 * 2);
            *puVar1 = *puVar1 ^ (ushort)((bVar2 >> ((uint)lVar14 & 0x1f) & 1) != 0);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          local_c4 = local_c4 + 1;
        }
        lVar14 = 0;
        do {
          puVar1 = (ushort *)((long)&local_108 + lVar14 * 2);
          *puVar1 = *puVar1 ^ *(ushort *)
                               ((long)&local_60[(uVar18 >> 3 & 0x1fffffff) * 2].vt + lVar14 * 2) >>
                              (((char)uVar22 - (char)uVar29) * '\x04' & 0xcU);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 8);
      }
      lVar14 = 0;
      do {
        puVar1 = (ushort *)((long)&__s->vt + lVar14 * 2);
        *puVar1 = *puVar1 | (ushort)((*(ushort *)((long)&local_108 + lVar14 * 2) & 0xf) <<
                                    ((byte)iVar19 & 0x1f));
        lVar14 = lVar14 + 1;
      } while (lVar14 != 8);
      iVar19 = iVar19 + 4;
      bVar32 = iVar19 == 0x10;
      if (bVar32) {
        iVar19 = 0;
      }
      __s = __s + (ulong)bVar32 * 2;
      uVar22 = uVar22 + 1;
      uVar18 = uVar18 + 2;
      uVar16 = local_84 + 2;
    } while (uVar22 != uVar17);
  }
  smemclr(&local_d8,0x10);
  smemclr(&local_108,0x10);
  uVar17 = local_a8 * 2;
  if (4 < local_a8) {
    uVar29 = 8;
    do {
      puVar1 = (ushort *)((long)&local_80[-0x2a].vt + uVar29 * 2);
      *puVar1 = ~*puVar1;
      puVar1 = (ushort *)((long)local_80 + uVar29 * 2 + -0x14e);
      *puVar1 = ~*puVar1;
      puVar1 = (ushort *)((long)local_80 + uVar29 * 2 + -0x146);
      *puVar1 = ~*puVar1;
      puVar1 = (ushort *)((long)local_80 + uVar29 * 2 + -0x144);
      *puVar1 = ~*puVar1;
      uVar29 = uVar29 + 8;
    } while (uVar29 < uVar17);
  }
  if (local_a8 != 0) {
    lVar14 = 0;
    do {
      *(ulong *)((long)&local_80[-0xa2].vt + lVar14 * 4) =
           (ulong)*(ushort *)((long)&local_80[-0x2a].vt + lVar14) * 0x1000100010001;
      lVar14 = lVar14 + 2;
    } while ((uVar17 + (uVar17 == 0)) * 2 != lVar14);
  }
  return;
}

Assistant:

static void aes_sw_setkey(ssh_cipher *ciph, const void *vkey)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    aes_sliced_key_setup(&ctx->sk, vkey, ctx->ciph.vt->real_keybits);
}